

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

_Bool recorded_iter_next(hdr_iter *iter)

{
  _Bool _Var1;
  
  do {
    _Var1 = basic_iter_next(iter);
    if (!_Var1) {
      return _Var1;
    }
  } while (iter->count == 0);
  iter->value_iterated_from = iter->value_iterated_to;
  iter->value_iterated_to = iter->value;
  (iter->specifics).linear.value_units_per_bucket = iter->count;
  return _Var1;
}

Assistant:

static bool recorded_iter_next(struct hdr_iter* iter)
{
    while (basic_iter_next(iter))
    {
        if (iter->count != 0)
        {
            update_iterated_values(iter, iter->value);

            iter->specifics.recorded.count_added_in_this_iteration_step = iter->count;
            return true;
        }
    }

    return false;
}